

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generatorprofile.cpp
# Opt level: O2

void __thiscall
GeneratorProfile_defaultArithmeticOperatorValues_Test::TestBody
          (GeneratorProfile_defaultArithmeticOperatorValues_Test *this)

{
  char *pcVar1;
  AssertHelper local_50 [8];
  AssertionResult gtest_ar;
  AssertionResult gtest_ar_16;
  GeneratorProfilePtr generatorProfile;
  
  libcellml::GeneratorProfile::create((Profile)&generatorProfile);
  libcellml::GeneratorProfile::plusString_abi_cxx11_();
  testing::internal::CmpHelperEQ<char[2],std::__cxx11::string>
            ((internal *)&gtest_ar,"\"+\"","generatorProfile->plusString()",(char (*) [2])"+",
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&gtest_ar_16);
  std::__cxx11::string::~string((string *)&gtest_ar_16);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&gtest_ar_16);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (local_50,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/generator/generatorprofile.cpp"
               ,0x4e,pcVar1);
    testing::internal::AssertHelper::operator=(local_50,(Message *)&gtest_ar_16);
    testing::internal::AssertHelper::~AssertHelper(local_50);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&gtest_ar_16);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  libcellml::GeneratorProfile::minusString_abi_cxx11_();
  testing::internal::CmpHelperEQ<char[2],std::__cxx11::string>
            ((internal *)&gtest_ar,"\"-\"","generatorProfile->minusString()",(char (*) [2])"-",
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&gtest_ar_16);
  std::__cxx11::string::~string((string *)&gtest_ar_16);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&gtest_ar_16);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (local_50,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/generator/generatorprofile.cpp"
               ,0x4f,pcVar1);
    testing::internal::AssertHelper::operator=(local_50,(Message *)&gtest_ar_16);
    testing::internal::AssertHelper::~AssertHelper(local_50);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&gtest_ar_16);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  libcellml::GeneratorProfile::timesString_abi_cxx11_();
  testing::internal::CmpHelperEQ<char[2],std::__cxx11::string>
            ((internal *)&gtest_ar,"\"*\"","generatorProfile->timesString()",(char (*) [2])"*",
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&gtest_ar_16);
  std::__cxx11::string::~string((string *)&gtest_ar_16);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&gtest_ar_16);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (local_50,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/generator/generatorprofile.cpp"
               ,0x50,pcVar1);
    testing::internal::AssertHelper::operator=(local_50,(Message *)&gtest_ar_16);
    testing::internal::AssertHelper::~AssertHelper(local_50);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&gtest_ar_16);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  libcellml::GeneratorProfile::divideString_abi_cxx11_();
  testing::internal::CmpHelperEQ<char[2],std::__cxx11::string>
            ((internal *)&gtest_ar,"\"/\"","generatorProfile->divideString()",(char (*) [2])"/",
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&gtest_ar_16);
  std::__cxx11::string::~string((string *)&gtest_ar_16);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&gtest_ar_16);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (local_50,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/generator/generatorprofile.cpp"
               ,0x51,pcVar1);
    testing::internal::AssertHelper::operator=(local_50,(Message *)&gtest_ar_16);
    testing::internal::AssertHelper::~AssertHelper(local_50);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&gtest_ar_16);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  libcellml::GeneratorProfile::powerString_abi_cxx11_();
  testing::internal::CmpHelperEQ<char[4],std::__cxx11::string>
            ((internal *)&gtest_ar,"\"pow\"","generatorProfile->powerString()",(char (*) [4])"pow",
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&gtest_ar_16);
  std::__cxx11::string::~string((string *)&gtest_ar_16);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&gtest_ar_16);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (local_50,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/generator/generatorprofile.cpp"
               ,0x52,pcVar1);
    testing::internal::AssertHelper::operator=(local_50,(Message *)&gtest_ar_16);
    testing::internal::AssertHelper::~AssertHelper(local_50);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&gtest_ar_16);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  libcellml::GeneratorProfile::squareRootString_abi_cxx11_();
  testing::internal::CmpHelperEQ<char[5],std::__cxx11::string>
            ((internal *)&gtest_ar,"\"sqrt\"","generatorProfile->squareRootString()",
             (char (*) [5])"sqrt",
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&gtest_ar_16);
  std::__cxx11::string::~string((string *)&gtest_ar_16);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&gtest_ar_16);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (local_50,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/generator/generatorprofile.cpp"
               ,0x53,pcVar1);
    testing::internal::AssertHelper::operator=(local_50,(Message *)&gtest_ar_16);
    testing::internal::AssertHelper::~AssertHelper(local_50);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&gtest_ar_16);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  libcellml::GeneratorProfile::squareString_abi_cxx11_();
  pcVar1 = "";
  testing::internal::CmpHelperEQ<char[1],std::__cxx11::string>
            ((internal *)&gtest_ar,"\"\"","generatorProfile->squareString()",(char (*) [1])0x15acbb,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&gtest_ar_16);
  std::__cxx11::string::~string((string *)&gtest_ar_16);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&gtest_ar_16);
    if (gtest_ar.message_.ptr_ !=
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar1 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (local_50,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/generator/generatorprofile.cpp"
               ,0x54,pcVar1);
    testing::internal::AssertHelper::operator=(local_50,(Message *)&gtest_ar_16);
    testing::internal::AssertHelper::~AssertHelper(local_50);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&gtest_ar_16);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  libcellml::GeneratorProfile::absoluteValueString_abi_cxx11_();
  testing::internal::CmpHelperEQ<char[5],std::__cxx11::string>
            ((internal *)&gtest_ar,"\"fabs\"","generatorProfile->absoluteValueString()",
             (char (*) [5])"fabs",
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&gtest_ar_16);
  std::__cxx11::string::~string((string *)&gtest_ar_16);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&gtest_ar_16);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (local_50,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/generator/generatorprofile.cpp"
               ,0x55,pcVar1);
    testing::internal::AssertHelper::operator=(local_50,(Message *)&gtest_ar_16);
    testing::internal::AssertHelper::~AssertHelper(local_50);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&gtest_ar_16);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  libcellml::GeneratorProfile::exponentialString_abi_cxx11_();
  testing::internal::CmpHelperEQ<char[4],std::__cxx11::string>
            ((internal *)&gtest_ar,"\"exp\"","generatorProfile->exponentialString()",
             (char (*) [4])"exp",
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&gtest_ar_16);
  std::__cxx11::string::~string((string *)&gtest_ar_16);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&gtest_ar_16);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (local_50,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/generator/generatorprofile.cpp"
               ,0x56,pcVar1);
    testing::internal::AssertHelper::operator=(local_50,(Message *)&gtest_ar_16);
    testing::internal::AssertHelper::~AssertHelper(local_50);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&gtest_ar_16);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  libcellml::GeneratorProfile::naturalLogarithmString_abi_cxx11_();
  testing::internal::CmpHelperEQ<char[4],std::__cxx11::string>
            ((internal *)&gtest_ar,"\"log\"","generatorProfile->naturalLogarithmString()",
             (char (*) [4])"log",
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&gtest_ar_16);
  std::__cxx11::string::~string((string *)&gtest_ar_16);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&gtest_ar_16);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (local_50,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/generator/generatorprofile.cpp"
               ,0x57,pcVar1);
    testing::internal::AssertHelper::operator=(local_50,(Message *)&gtest_ar_16);
    testing::internal::AssertHelper::~AssertHelper(local_50);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&gtest_ar_16);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  libcellml::GeneratorProfile::commonLogarithmString_abi_cxx11_();
  testing::internal::CmpHelperEQ<char[6],std::__cxx11::string>
            ((internal *)&gtest_ar,"\"log10\"","generatorProfile->commonLogarithmString()",
             (char (*) [6])"log10",
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&gtest_ar_16);
  std::__cxx11::string::~string((string *)&gtest_ar_16);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&gtest_ar_16);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (local_50,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/generator/generatorprofile.cpp"
               ,0x58,pcVar1);
    testing::internal::AssertHelper::operator=(local_50,(Message *)&gtest_ar_16);
    testing::internal::AssertHelper::~AssertHelper(local_50);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&gtest_ar_16);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  libcellml::GeneratorProfile::ceilingString_abi_cxx11_();
  testing::internal::CmpHelperEQ<char[5],std::__cxx11::string>
            ((internal *)&gtest_ar,"\"ceil\"","generatorProfile->ceilingString()",
             (char (*) [5])"ceil",
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&gtest_ar_16);
  std::__cxx11::string::~string((string *)&gtest_ar_16);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&gtest_ar_16);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (local_50,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/generator/generatorprofile.cpp"
               ,0x59,pcVar1);
    testing::internal::AssertHelper::operator=(local_50,(Message *)&gtest_ar_16);
    testing::internal::AssertHelper::~AssertHelper(local_50);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&gtest_ar_16);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  libcellml::GeneratorProfile::floorString_abi_cxx11_();
  testing::internal::CmpHelperEQ<char[6],std::__cxx11::string>
            ((internal *)&gtest_ar,"\"floor\"","generatorProfile->floorString()",
             (char (*) [6])"floor",
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&gtest_ar_16);
  std::__cxx11::string::~string((string *)&gtest_ar_16);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&gtest_ar_16);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (local_50,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/generator/generatorprofile.cpp"
               ,0x5a,pcVar1);
    testing::internal::AssertHelper::operator=(local_50,(Message *)&gtest_ar_16);
    testing::internal::AssertHelper::~AssertHelper(local_50);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&gtest_ar_16);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  libcellml::GeneratorProfile::minString_abi_cxx11_();
  testing::internal::CmpHelperEQ<char[4],std::__cxx11::string>
            ((internal *)&gtest_ar,"\"min\"","generatorProfile->minString()",(char (*) [4])"min",
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&gtest_ar_16);
  std::__cxx11::string::~string((string *)&gtest_ar_16);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&gtest_ar_16);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (local_50,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/generator/generatorprofile.cpp"
               ,0x5b,pcVar1);
    testing::internal::AssertHelper::operator=(local_50,(Message *)&gtest_ar_16);
    testing::internal::AssertHelper::~AssertHelper(local_50);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&gtest_ar_16);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  libcellml::GeneratorProfile::maxString_abi_cxx11_();
  testing::internal::CmpHelperEQ<char[4],std::__cxx11::string>
            ((internal *)&gtest_ar,"\"max\"","generatorProfile->maxString()",(char (*) [4])"max",
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&gtest_ar_16);
  std::__cxx11::string::~string((string *)&gtest_ar_16);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&gtest_ar_16);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (local_50,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/generator/generatorprofile.cpp"
               ,0x5c,pcVar1);
    testing::internal::AssertHelper::operator=(local_50,(Message *)&gtest_ar_16);
    testing::internal::AssertHelper::~AssertHelper(local_50);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&gtest_ar_16);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  libcellml::GeneratorProfile::remString_abi_cxx11_();
  testing::internal::CmpHelperEQ<char[5],std::__cxx11::string>
            ((internal *)&gtest_ar,"\"fmod\"","generatorProfile->remString()",(char (*) [5])"fmod",
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&gtest_ar_16);
  std::__cxx11::string::~string((string *)&gtest_ar_16);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&gtest_ar_16);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (local_50,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/generator/generatorprofile.cpp"
               ,0x5d,pcVar1);
    testing::internal::AssertHelper::operator=(local_50,(Message *)&gtest_ar_16);
    testing::internal::AssertHelper::~AssertHelper(local_50);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&gtest_ar_16);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  gtest_ar.success_ = false;
  local_50[0] = (AssertHelper)libcellml::GeneratorProfile::hasPowerOperator();
  testing::internal::CmpHelperEQ<bool,bool>
            ((internal *)&gtest_ar_16,"false","generatorProfile->hasPowerOperator()",
             &gtest_ar.success_,(bool *)local_50);
  if (gtest_ar_16.success_ == false) {
    testing::Message::Message((Message *)&gtest_ar);
    if (gtest_ar_16.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = ((gtest_ar_16.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (local_50,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/generator/generatorprofile.cpp"
               ,0x5f,pcVar1);
    testing::internal::AssertHelper::operator=(local_50,(Message *)&gtest_ar);
    testing::internal::AssertHelper::~AssertHelper(local_50);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&gtest_ar);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar_16.message_);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&generatorProfile.
              super___shared_ptr<libcellml::GeneratorProfile,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  return;
}

Assistant:

TEST(GeneratorProfile, defaultArithmeticOperatorValues)
{
    libcellml::GeneratorProfilePtr generatorProfile = libcellml::GeneratorProfile::create();

    EXPECT_EQ("+", generatorProfile->plusString());
    EXPECT_EQ("-", generatorProfile->minusString());
    EXPECT_EQ("*", generatorProfile->timesString());
    EXPECT_EQ("/", generatorProfile->divideString());
    EXPECT_EQ("pow", generatorProfile->powerString());
    EXPECT_EQ("sqrt", generatorProfile->squareRootString());
    EXPECT_EQ("", generatorProfile->squareString());
    EXPECT_EQ("fabs", generatorProfile->absoluteValueString());
    EXPECT_EQ("exp", generatorProfile->exponentialString());
    EXPECT_EQ("log", generatorProfile->naturalLogarithmString());
    EXPECT_EQ("log10", generatorProfile->commonLogarithmString());
    EXPECT_EQ("ceil", generatorProfile->ceilingString());
    EXPECT_EQ("floor", generatorProfile->floorString());
    EXPECT_EQ("min", generatorProfile->minString());
    EXPECT_EQ("max", generatorProfile->maxString());
    EXPECT_EQ("fmod", generatorProfile->remString());

    EXPECT_EQ(false, generatorProfile->hasPowerOperator());
}